

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  uchar uVar1;
  ushort uVar2;
  short sVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  stbi_uc sVar8;
  stbi_uc sVar9;
  byte bVar10;
  stbi__uint32 sVar11;
  int iVar12;
  stbi__uint32 sVar13;
  int iVar14;
  int iVar15;
  stbi__uint32 sVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined8 *puVar20;
  void *pvVar21;
  stbi__context *data;
  stbi__uint16 *psVar22;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar23;
  uint uVar24;
  uint uVar25;
  char *pcVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  ulong uVar32;
  long lVar33;
  stbi__uint16 *psVar34;
  ulong uVar35;
  int iVar36;
  bool bVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  stbi_uc pal [256] [4];
  uint local_8940;
  uint local_892c;
  stbi__uint16 *local_8928;
  uint local_88d8;
  stbi__bmp_data local_88cc;
  stbi__gif local_88a8;
  
  psVar23 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  lVar33 = 0;
  ri_00 = ri;
  do {
    sVar8 = stbi__get8(s);
    sVar9 = (&stbi__check_png_header_png_sig)[lVar33];
    if (sVar8 != sVar9) {
      puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      *puVar20 = "Not a PNG";
      break;
    }
    lVar33 = lVar33 + 1;
  } while (lVar33 != 8);
  uVar4 = *(undefined4 *)((long)&s->img_buffer_original + 4);
  uVar5 = *(undefined4 *)&s->img_buffer_original_end;
  uVar6 = *(undefined4 *)((long)&s->img_buffer_original_end + 4);
  *(undefined4 *)&s->img_buffer = *(undefined4 *)&s->img_buffer_original;
  *(undefined4 *)((long)&s->img_buffer + 4) = uVar4;
  *(undefined4 *)&s->img_buffer_end = uVar5;
  *(undefined4 *)((long)&s->img_buffer_end + 4) = uVar6;
  if (sVar8 == sVar9) {
    local_88a8._0_8_ = s;
    if ((uint)req_comp < 5) {
      iVar12 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      psVar22 = (stbi__uint16 *)local_88a8.history;
      uVar7 = local_88a8._0_8_;
      psVar34 = (stbi__uint16 *)0x0;
      if (iVar12 != 0) {
        iVar12 = 8;
        if ((8 < local_88a8.flags) && (iVar12 = 0x10, local_88a8.flags != 0x10)) {
          puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
          pcVar26 = "PNG not supported: unsupported color depth";
          goto LAB_001c0471;
        }
        ri->bits_per_channel = iVar12;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar12 = *(int *)(local_88a8._0_8_ + 0xc), iVar12 != req_comp)) {
          if (local_88a8.flags < 9) {
            psVar22 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)psVar22,iVar12,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            psVar22 = stbi__convert_format16
                                (psVar22,iVar12,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar7 + 0xc) = req_comp;
          if (psVar22 == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)local_88a8._0_8_;
        *y = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar34 = psVar22;
        if (comp != (int *)0x0) {
          *comp = *(int *)(local_88a8._0_8_ + 8);
        }
      }
      free(local_88a8.history);
      local_88a8.history = (stbi_uc *)0x0;
      free(local_88a8.background);
      local_88a8.background = (stbi_uc *)0x0;
      free(local_88a8.out);
      return psVar34;
    }
    puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
    pcVar26 = "Internal error";
    goto LAB_001c0471;
  }
  sVar9 = stbi__get8(s);
  if ((sVar9 == 'B') && (sVar9 = stbi__get8(s), sVar9 == 'M')) {
    stbi__get32le(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get32le(s);
    sVar11 = stbi__get32le(s);
    if (((0x38 < sVar11) || ((0x100010000001000U >> ((ulong)sVar11 & 0x3f) & 1) == 0)) &&
       ((sVar11 != 0x7c && (sVar11 != 0x6c)))) goto LAB_001c05aa;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    local_88cc.all_a = 0xff;
    pvVar21 = stbi__bmp_parse_header(s,&local_88cc);
    local_8928._0_4_ = local_88cc.all_a;
    if (pvVar21 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar27 = s->img_y;
    uVar28 = -uVar27;
    if (0 < (int)uVar27) {
      uVar28 = uVar27;
    }
    s->img_y = uVar28;
    if ((0x1000000 < uVar28) || (0x1000000 < s->img_x)) {
LAB_001c09a9:
      puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar26 = "Very large image (corrupt?)";
      goto LAB_001c0471;
    }
    if (local_88cc.hsz == 0xc) {
      if (local_88cc.bpp < 0x18) {
        uVar30 = (ulong)(uint)(((local_88cc.offset - local_88cc.extra_read) + -0x18) / 3);
      }
      else {
LAB_001c09e0:
        uVar30 = 0;
      }
    }
    else {
      if (0xf < local_88cc.bpp) goto LAB_001c09e0;
      uVar30 = (ulong)(uint)(local_88cc.offset - (local_88cc.extra_read + local_88cc.hsz) >> 2);
    }
    iVar12 = (int)uVar30;
    if (iVar12 == 0) {
      iVar15 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) + s->callback_already_read
      ;
      if (((0xfffffbff < iVar15 - 0x401U) && (iVar15 <= local_88cc.offset)) &&
         (local_88cc.offset - iVar15 < 0x401)) {
        stbi__skip(s,local_88cc.offset - iVar15);
        goto LAB_001c0a16;
      }
LAB_001c0b23:
      puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar26 = "Corrupt BMP";
      goto LAB_001c0471;
    }
LAB_001c0a16:
    uVar28 = local_88cc.ma ^ 0xff000000;
    s->img_n = 4 - (uint)(local_88cc.ma == 0 || local_88cc.bpp == 0x18 && uVar28 == 0);
    iVar15 = req_comp;
    if (req_comp < 3) {
      iVar15 = s->img_n;
    }
    sVar11 = s->img_x;
    sVar13 = s->img_y;
    iVar14 = stbi__mad3sizes_valid(iVar15,sVar11,sVar13,0);
    if (iVar14 == 0) goto LAB_001c0b23;
    data_00 = (uchar *)stbi__malloc_mad3(iVar15,sVar11,sVar13,0);
    if (data_00 != (uchar *)0x0) {
      if (local_88cc.bpp < 0x10) {
        if (iVar12 < 0x101 && iVar12 != 0) {
          if (0 < iVar12) {
            uVar35 = 0;
            do {
              sVar9 = stbi__get8(s);
              local_88a8.pal[uVar35 - 0xd][2] = sVar9;
              sVar9 = stbi__get8(s);
              local_88a8.pal[uVar35 - 0xd][1] = sVar9;
              sVar9 = stbi__get8(s);
              local_88a8.pal[uVar35 - 0xd][0] = sVar9;
              if (local_88cc.hsz != 0xc) {
                stbi__get8(s);
              }
              local_88a8.pal[uVar35 - 0xd][3] = 0xff;
              uVar35 = uVar35 + 1;
            } while (uVar30 != uVar35);
          }
          stbi__skip(s,(iVar12 * (local_88cc.hsz == 0xc | 0xfffffffc) + local_88cc.offset) -
                       (local_88cc.hsz + local_88cc.extra_read));
          if (local_88cc.bpp == 8) {
            uVar28 = s->img_x;
          }
          else if (local_88cc.bpp == 4) {
            uVar28 = s->img_x + 1 >> 1;
          }
          else {
            if (local_88cc.bpp != 1) goto LAB_001c0ade;
            uVar28 = s->img_x + 7 >> 3;
          }
          if (local_88cc.bpp == 1) {
            if (0 < (int)s->img_y) {
              iVar12 = 0;
              iVar14 = 0;
              do {
                bVar10 = stbi__get8(s);
                uVar25 = (uint)bVar10;
                uVar24 = 7;
                sVar11 = 1;
                do {
                  sVar13 = s->img_x;
                  if ((int)sVar13 <= (int)(sVar11 - 1)) break;
                  uVar30 = (ulong)((uVar25 >> (uVar24 & 0x1f) & 1) != 0);
                  data_00[iVar12] = local_88a8.pal[uVar30 - 0xd][0];
                  data_00[(long)iVar12 + 1] = local_88a8.pal[uVar30 - 0xd][1];
                  data_00[(long)iVar12 + 2] = local_88a8.pal[uVar30 - 0xd][2];
                  iVar18 = iVar12 + 3;
                  if (iVar15 == 4) {
                    data_00[(long)iVar12 + 3] = 0xff;
                    iVar18 = iVar12 + 4;
                  }
                  iVar12 = iVar18;
                  if (sVar11 != sVar13) {
                    if ((int)uVar24 < 1) {
                      bVar10 = stbi__get8(s);
                      uVar25 = (uint)bVar10;
                      uVar24 = 7;
                    }
                    else {
                      uVar24 = uVar24 - 1;
                    }
                  }
                  bVar38 = sVar11 != sVar13;
                  sVar11 = sVar11 + 1;
                } while (bVar38);
                stbi__skip(s,-uVar28 & 3);
                iVar14 = iVar14 + 1;
              } while (iVar14 < (int)s->img_y);
            }
          }
          else if (0 < (int)s->img_y) {
            uVar30 = 0;
            iVar12 = 0;
            do {
              if (0 < (int)s->img_x) {
                iVar14 = 0;
                do {
                  bVar10 = stbi__get8(s);
                  uVar24 = bVar10 & 0xf;
                  uVar25 = (uint)(bVar10 >> 4);
                  if (local_88cc.bpp != 4) {
                    uVar25 = (uint)bVar10;
                  }
                  uVar35 = (ulong)uVar25;
                  if (local_88cc.bpp != 4) {
                    uVar24 = 0;
                  }
                  iVar18 = (int)uVar30;
                  uVar25 = iVar18 + 3;
                  data_00[iVar18] = local_88a8.pal[uVar35 - 0xd][0];
                  data_00[(long)iVar18 + 1] = local_88a8.pal[uVar35 - 0xd][1];
                  data_00[(long)iVar18 + 2] = local_88a8.pal[uVar35 - 0xd][2];
                  if (iVar15 == 4) {
                    uVar25 = iVar18 + 4;
                    data_00[(long)iVar18 + 3] = 0xff;
                  }
                  sVar11 = s->img_x;
                  if (iVar14 + 1U == sVar11) {
LAB_001c11a0:
                    uVar30 = (ulong)uVar25;
                  }
                  else {
                    if (local_88cc.bpp == 8) {
                      bVar10 = stbi__get8(s);
                      uVar24 = (uint)bVar10;
                    }
                    lVar33 = (long)(int)uVar25;
                    uVar30 = lVar33 + 3;
                    uVar35 = (ulong)uVar24;
                    data_00[lVar33] = local_88a8.pal[uVar35 - 0xd][0];
                    data_00[lVar33 + 1] = local_88a8.pal[uVar35 - 0xd][1];
                    data_00[lVar33 + 2] = local_88a8.pal[uVar35 - 0xd][2];
                    if (iVar15 == 4) {
                      uVar25 = uVar25 + 4;
                      data_00[lVar33 + 3] = 0xff;
                      goto LAB_001c11a0;
                    }
                  }
                } while ((iVar14 + 1U != sVar11) && (iVar14 = iVar14 + 2, iVar14 < (int)s->img_x));
              }
              stbi__skip(s,-uVar28 & 3);
              iVar12 = iVar12 + 1;
            } while (iVar12 < (int)s->img_y);
          }
          goto LAB_001c13c5;
        }
LAB_001c0ade:
        free(data_00);
        goto LAB_001c0b23;
      }
      stbi__skip(s,local_88cc.offset - (local_88cc.hsz + local_88cc.extra_read));
      if (local_88cc.bpp == 0x18) {
        iVar12 = -3;
LAB_001c0dca:
        uVar25 = iVar12 * s->img_x & 3;
      }
      else {
        uVar25 = 0;
        if (local_88cc.bpp == 0x10) {
          iVar12 = -2;
          goto LAB_001c0dca;
        }
      }
      if (local_88cc.bpp == 0x18) {
        bVar38 = false;
LAB_001c0e19:
        bVar37 = false;
      }
      else {
        if (local_88cc.bpp != 0x20) {
          bVar38 = true;
          goto LAB_001c0e19;
        }
        bVar37 = (local_88cc.mr == 0xff0000 && (local_88cc.mg == 0xff00 && local_88cc.mb == 0xff))
                 && uVar28 == 0;
        bVar38 = (local_88cc.mr != 0xff0000 || (local_88cc.mg != 0xff00 || local_88cc.mb != 0xff))
                 || uVar28 != 0;
      }
      iVar17 = 0;
      iVar12 = 0;
      iVar14 = 0;
      iVar18 = 0;
      local_8940 = 0;
      uVar28 = 0;
      local_892c = 0;
      local_88d8 = 0;
      if (bVar38) {
        if (local_88cc.mb != 0 && (local_88cc.mg != 0 && local_88cc.mr != 0)) {
          iVar17 = stbi__high_bit(local_88cc.mr);
          local_8940 = stbi__bitcount(local_88cc.mr);
          iVar12 = stbi__high_bit(local_88cc.mg);
          uVar28 = stbi__bitcount(local_88cc.mg);
          iVar14 = stbi__high_bit(local_88cc.mb);
          local_892c = stbi__bitcount(local_88cc.mb);
          iVar18 = stbi__high_bit(local_88cc.ma);
          local_88d8 = stbi__bitcount(local_88cc.ma);
          if ((local_88d8 < 9 && local_892c < 9) && (uVar28 < 9 && local_8940 < 9)) {
            iVar17 = iVar17 + -7;
            iVar12 = iVar12 + -7;
            iVar14 = iVar14 + -7;
            iVar18 = iVar18 + -7;
            goto LAB_001c1209;
          }
        }
        free(data_00);
        puVar20 = (undefined8 *)__tls_get_addr();
        *puVar20 = "Corrupt BMP";
        bVar38 = false;
      }
      else {
LAB_001c1209:
        if (0 < (int)s->img_y) {
          iVar36 = 0;
          iVar31 = 0;
          do {
            if (bVar38) {
              if (0 < (int)s->img_x) {
                iVar29 = 0;
                do {
                  if (local_88cc.bpp == 0x10) {
                    sVar9 = stbi__get8(s);
                    sVar8 = stbi__get8(s);
                    sVar11 = (stbi__uint32)CONCAT11(sVar8,sVar9);
                  }
                  else {
                    sVar11 = stbi__get32le(s);
                  }
                  iVar19 = stbi__shiftsigned(sVar11 & local_88cc.mr,iVar17,local_8940);
                  data_00[iVar36] = (uchar)iVar19;
                  iVar19 = stbi__shiftsigned(sVar11 & local_88cc.mg,iVar12,uVar28);
                  data_00[(long)iVar36 + 1] = (uchar)iVar19;
                  iVar19 = stbi__shiftsigned(sVar11 & local_88cc.mb,iVar14,local_892c);
                  data_00[(long)iVar36 + 2] = (uchar)iVar19;
                  if (local_88cc.ma == 0) {
                    uVar24 = 0xff;
                  }
                  else {
                    uVar24 = stbi__shiftsigned(sVar11 & local_88cc.ma,iVar18,local_88d8);
                  }
                  iVar19 = iVar36 + 3;
                  if (iVar15 == 4) {
                    data_00[(long)iVar36 + 3] = (uchar)uVar24;
                    iVar19 = iVar36 + 4;
                  }
                  iVar36 = iVar19;
                  local_8928._0_4_ = (uint)local_8928 | uVar24;
                  iVar29 = iVar29 + 1;
                } while (iVar29 < (int)s->img_x);
              }
            }
            else if (0 < (int)s->img_x) {
              iVar29 = 0;
              do {
                sVar9 = stbi__get8(s);
                data_00[(long)iVar36 + 2] = sVar9;
                sVar9 = stbi__get8(s);
                data_00[(long)iVar36 + 1] = sVar9;
                sVar9 = stbi__get8(s);
                data_00[iVar36] = sVar9;
                bVar10 = 0xff;
                if (bVar37) {
                  bVar10 = stbi__get8(s);
                }
                iVar19 = iVar36 + 3;
                if (iVar15 == 4) {
                  data_00[(long)iVar36 + 3] = bVar10;
                  iVar19 = iVar36 + 4;
                }
                iVar36 = iVar19;
                local_8928._0_4_ = (uint)local_8928 | bVar10;
                iVar29 = iVar29 + 1;
              } while (iVar29 < (int)s->img_x);
            }
            stbi__skip(s,uVar25);
            iVar31 = iVar31 + 1;
          } while (iVar31 < (int)s->img_y);
        }
        bVar38 = true;
      }
      if (!bVar38) {
        return (void *)0x0;
      }
LAB_001c13c5:
      if (((iVar15 == 4) && ((uint)local_8928 == 0)) &&
         (iVar12 = s->img_x * s->img_y * 4, -1 < iVar12 + -1)) {
        lVar33 = (ulong)(iVar12 - 4) + 7;
        do {
          data_00[lVar33 + -4] = 0xff;
          lVar33 = lVar33 + -4;
        } while (3 < lVar33);
      }
      if (0 < (int)uVar27) {
        uVar27 = (int)s->img_y >> 1;
        if (0 < (int)uVar27) {
          uVar25 = s->img_x * iVar15;
          uVar28 = (s->img_y - 1) * uVar25;
          uVar30 = 0;
          uVar35 = 0;
          do {
            if (0 < (int)uVar25) {
              uVar32 = 0;
              do {
                uVar1 = data_00[uVar32 + uVar30];
                data_00[uVar32 + uVar30] = data_00[uVar32 + uVar28];
                data_00[uVar32 + uVar28] = uVar1;
                uVar32 = uVar32 + 1;
              } while (uVar25 != uVar32);
            }
            uVar35 = uVar35 + 1;
            uVar28 = uVar28 - uVar25;
            uVar30 = (ulong)((int)uVar30 + uVar25);
          } while (uVar35 != uVar27);
        }
      }
      if ((iVar15 != req_comp && req_comp != 0) &&
         (data_00 = stbi__convert_format(data_00,iVar15,req_comp,s->img_x,s->img_y),
         data_00 == (uchar *)0x0)) {
        return (void *)0x0;
      }
      *x = s->img_x;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return data_00;
      }
      return data_00;
    }
  }
  else {
LAB_001c05aa:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar12 = stbi__gif_test(s);
    if (iVar12 != 0) {
      memset(&local_88a8,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar23);
      if (data == s) {
        data = (stbi__context *)0x0;
      }
      if (data == (stbi__context *)0x0) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a8.w;
        *y = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      free(local_88a8.background);
      return data;
    }
    sVar11 = stbi__get32be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (sVar11 != 0x38425053) {
      iVar12 = stbi__pic_test(s);
      if (iVar12 != 0) {
        pvVar21 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar21;
      }
      iVar12 = stbi__jpeg_test(s);
      if (iVar12 != 0) {
        pvVar21 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
        return pvVar21;
      }
      iVar12 = stbi__pnm_test(s);
      if (iVar12 != 0) {
        pvVar21 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar21;
      }
      iVar12 = stbi__hdr_test(s);
      if (iVar12 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar23 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar23;
      }
      iVar12 = stbi__tga_test(s);
      if (iVar12 != 0) {
        pvVar21 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar21;
      }
      puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar26 = "Image not of any known type, or corrupt";
      goto LAB_001c0471;
    }
    sVar11 = stbi__get32be(s);
    if (sVar11 != 0x38425053) {
      puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar26 = "Corrupt PSD image";
      goto LAB_001c0471;
    }
    sVar9 = stbi__get8(s);
    sVar8 = stbi__get8(s);
    if (CONCAT11(sVar9,sVar8) != 1) {
      puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar26 = "Unsupported version of PSD image";
      goto LAB_001c0471;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001c0900:
      s->img_buffer = s->img_buffer + 6;
    }
    else {
      iVar12 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (5 < iVar12) goto LAB_001c0900;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar12);
    }
    sVar9 = stbi__get8(s);
    bVar10 = stbi__get8(s);
    uVar27 = (uint)CONCAT11(sVar9,bVar10);
    if (0x10 < uVar27) {
      puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar26 = "Unsupported number of channels in PSD image";
      goto LAB_001c0471;
    }
    sVar11 = stbi__get32be(s);
    sVar13 = stbi__get32be(s);
    if ((0x1000000 < (int)sVar11) || (0x1000000 < (int)sVar13)) goto LAB_001c09a9;
    sVar9 = stbi__get8(s);
    sVar8 = stbi__get8(s);
    sVar3 = CONCAT11(sVar9,sVar8);
    if ((sVar3 != 8) && (sVar3 != 0x10)) {
      puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar26 = "PSD bit depth is not 8 or 16 bit";
      goto LAB_001c0471;
    }
    sVar9 = stbi__get8(s);
    sVar8 = stbi__get8(s);
    if (CONCAT11(sVar9,sVar8) != 3) {
      puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar26 = "PSD is not in RGB color format";
      goto LAB_001c0471;
    }
    sVar16 = stbi__get32be(s);
    stbi__skip(s,sVar16);
    sVar16 = stbi__get32be(s);
    stbi__skip(s,sVar16);
    sVar16 = stbi__get32be(s);
    stbi__skip(s,sVar16);
    uVar28 = stbi__get16be(s);
    if (1 < uVar28) {
      puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar26 = "PSD has an unknown compression format";
      goto LAB_001c0471;
    }
    iVar12 = stbi__mad3sizes_valid(4,sVar13,sVar11,0);
    if (iVar12 == 0) {
      puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      pcVar26 = "Corrupt PSD";
      goto LAB_001c0471;
    }
    if (((bpc == 0x10) && (sVar3 == 0x10)) && (uVar28 == 0)) {
      psVar22 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar13,sVar11,0);
      ri->bits_per_channel = 0x10;
    }
    else {
      psVar22 = (stbi__uint16 *)malloc((long)(int)(sVar11 * sVar13 * 4));
    }
    if (psVar22 != (stbi__uint16 *)0x0) {
      uVar25 = sVar13 * sVar11;
      if (uVar28 == 0) {
        uVar30 = 0;
        psVar34 = psVar22;
        local_8928 = psVar22;
        do {
          if (uVar30 < uVar27) {
            if (ri->bits_per_channel == 0x10) {
              if (0 < (int)uVar25) {
                lVar33 = 0;
                do {
                  sVar9 = stbi__get8(s);
                  sVar8 = stbi__get8(s);
                  local_8928[lVar33 * 4] = CONCAT11(sVar9,sVar8);
                  lVar33 = lVar33 + 1;
                } while (uVar25 != (uint)lVar33);
              }
            }
            else if (sVar3 == 0x10) {
              if (0 < (int)uVar25) {
                lVar33 = 0;
                do {
                  sVar9 = stbi__get8(s);
                  stbi__get8(s);
                  *(stbi_uc *)(psVar34 + lVar33 * 2) = sVar9;
                  lVar33 = lVar33 + 1;
                } while (uVar25 != (uint)lVar33);
              }
            }
            else if (0 < (int)uVar25) {
              lVar33 = 0;
              do {
                sVar9 = stbi__get8(s);
                *(stbi_uc *)(psVar34 + lVar33 * 2) = sVar9;
                lVar33 = lVar33 + 1;
              } while (uVar25 != (uint)lVar33);
            }
          }
          else if (sVar3 == 0x10 && bpc == 0x10) {
            if (0 < (int)uVar25) {
              lVar33 = 0;
              do {
                local_8928[lVar33 * 4] = -(ushort)(uVar30 == 3);
                lVar33 = lVar33 + 1;
              } while (uVar25 != (uint)lVar33);
            }
          }
          else if (0 < (int)uVar25) {
            lVar33 = 0;
            do {
              *(char *)(psVar34 + lVar33 * 2) = -(uVar30 == 3);
              lVar33 = lVar33 + 1;
            } while (uVar25 != (uint)lVar33);
          }
          uVar30 = uVar30 + 1;
          psVar34 = (stbi__uint16 *)((long)psVar34 + 1);
          local_8928 = local_8928 + 1;
        } while (uVar30 != 4);
      }
      else {
        stbi__skip(s,bVar10 * sVar11 * 2);
        uVar30 = 0;
        psVar34 = psVar22;
        do {
          if (uVar30 < uVar27) {
            iVar12 = stbi__psd_decode_rle(s,(stbi_uc *)((long)psVar22 + uVar30),uVar25);
            if (iVar12 == 0) {
              free(psVar22);
              puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
              pcVar26 = "bad RLE data";
              goto LAB_001c0471;
            }
          }
          else if (0 < (int)uVar25) {
            lVar33 = 0;
            do {
              *(char *)(psVar34 + lVar33 * 2) = -(uVar30 == 3);
              lVar33 = lVar33 + 1;
            } while (uVar25 != (uint)lVar33);
          }
          uVar30 = uVar30 + 1;
          psVar34 = (stbi__uint16 *)((long)psVar34 + 1);
        } while (uVar30 != 4);
      }
      if (3 < uVar27) {
        if (ri->bits_per_channel == 0x10) {
          if (0 < (int)uVar25) {
            uVar30 = 0;
            do {
              uVar2 = psVar22[uVar30 * 4 + 3];
              if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                fVar40 = 1.0 / ((float)uVar2 / 65535.0);
                fVar39 = (1.0 - fVar40) * 65535.0;
                psVar22[uVar30 * 4] =
                     (stbi__uint16)(int)((float)psVar22[uVar30 * 4] * fVar40 + fVar39);
                psVar22[uVar30 * 4 + 1] =
                     (stbi__uint16)(int)((float)psVar22[uVar30 * 4 + 1] * fVar40 + fVar39);
                psVar22[uVar30 * 4 + 2] =
                     (stbi__uint16)(int)((float)psVar22[uVar30 * 4 + 2] * fVar40 + fVar39);
              }
              uVar30 = uVar30 + 1;
            } while (uVar25 != uVar30);
          }
        }
        else if (0 < (int)uVar25) {
          uVar30 = 0;
          do {
            bVar10 = *(byte *)((long)psVar22 + uVar30 * 4 + 3);
            if ((bVar10 != 0) && (bVar10 != 0xff)) {
              fVar40 = 1.0 / ((float)bVar10 / 255.0);
              fVar39 = (1.0 - fVar40) * 255.0;
              *(char *)(psVar22 + uVar30 * 2) =
                   (char)(int)((float)(byte)psVar22[uVar30 * 2] * fVar40 + fVar39);
              *(char *)((long)psVar22 + uVar30 * 4 + 1) =
                   (char)(int)((float)*(byte *)((long)psVar22 + uVar30 * 4 + 1) * fVar40 + fVar39);
              *(char *)(psVar22 + uVar30 * 2 + 1) =
                   (char)(int)((float)(byte)psVar22[uVar30 * 2 + 1] * fVar40 + fVar39);
            }
            uVar30 = uVar30 + 1;
          } while (uVar25 != uVar30);
        }
      }
      if ((req_comp & 0xfffffffbU) != 0) {
        if (ri->bits_per_channel == 0x10) {
          psVar22 = stbi__convert_format16(psVar22,4,req_comp,sVar13,sVar11);
        }
        else {
          psVar22 = (stbi__uint16 *)stbi__convert_format((uchar *)psVar22,4,req_comp,sVar13,sVar11);
        }
        if (psVar22 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      *y = sVar11;
      *x = sVar13;
      return psVar22;
    }
  }
  puVar20 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
  pcVar26 = "Out of memory";
LAB_001c0471:
  *puVar20 = pcVar26;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}